

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX.h
# Opt level: O0

void __thiscall Bitmap_Item::~Bitmap_Item(Bitmap_Item *this)

{
  undefined8 uVar1;
  int local_24;
  int i;
  Colormap c;
  int screen_num;
  Bitmap_Item *this_local;
  
  if (this->display != (Display *)0x0) {
    if (this->bitmap != 0) {
      XFreePixmap(this->display,this->bitmap);
    }
    if (this->mask != 0) {
      XFreePixmap(this->display,this->mask);
    }
    if (this->inverted_mask != 0) {
      XFreePixmap(this->display,this->inverted_mask);
    }
  }
  if (this->colors != (XColor *)0x0) {
    uVar1 = XDefaultColormap(this->display,*(undefined4 *)(this->display + 0xe0));
    for (local_24 = 0; local_24 < this->num_colors; local_24 = local_24 + 1) {
      XFreeColors(this->display,uVar1,this->colors + local_24,1,0);
    }
    if (this->colors != (XColor *)0x0) {
      operator_delete__(this->colors);
    }
    this->colors = (XColor *)0x0;
  }
  return;
}

Assistant:

~Bitmap_Item()
  {
    if (display) {
      if (bitmap)
        XFreePixmap(display, bitmap);
      if (mask)
        XFreePixmap(display, mask);
      if (inverted_mask)
        XFreePixmap(display, inverted_mask);
    }
    if (colors) {
      int screen_num = DefaultScreen(display);
      Colormap c = XDefaultColormap(display, screen_num);
      for (int i = 0; i < num_colors; i++)
        XFreeColors(display, c, &(colors[i].pixel), 1, 0);
      delete[] colors;
      colors = nullptr;
    }
  }